

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeLiteGenerator::CreateProjectSourceEntries
          (cmExtraCodeLiteGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles,cmXMLWriter *_xml,string *projectPath,cmMakefile *mf,
          string *projectType,string *targetName)

{
  SystemInformation *this_00;
  cmXMLWriter *pcVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  cmSystemTools *this_01;
  char *remote;
  allocator local_551;
  string local_550;
  allocator local_529;
  string local_528;
  allocator local_501;
  string local_500;
  allocator local_4d9;
  string local_4d8;
  allocator local_4b1;
  string local_4b0;
  allocator local_489;
  string local_488;
  allocator local_461;
  string local_460;
  allocator local_439;
  string local_438;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  string local_388;
  allocator local_361;
  string local_360;
  string local_340;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  undefined1 local_268 [8];
  string relapath;
  string local_240;
  string local_220 [8];
  string outputPath;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  string codeliteCompilerName;
  SystemInformation info;
  string local_98;
  allocator local_61;
  string local_60;
  cmXMLWriter *local_40;
  cmXMLWriter *xml;
  cmMakefile *mf_local;
  string *projectPath_local;
  cmXMLWriter *_xml_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *otherFiles_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  *cFiles_local;
  cmExtraCodeLiteGenerator *this_local;
  
  local_40 = _xml;
  xml = (cmXMLWriter *)mf;
  mf_local = (cmMakefile *)projectPath;
  projectPath_local = (string *)_xml;
  _xml_local = (cmXMLWriter *)otherFiles;
  otherFiles_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)cFiles;
  cFiles_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                  *)this;
  FindMatchingHeaderfiles(this,cFiles,otherFiles);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"VirtualDirectory",&local_61);
  cmXMLWriter::StartElement(pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  cmXMLWriter::Attribute<char[4]>(local_40,"Name",(char (*) [4])0xa4919e);
  CreateFoldersAndFiles
            (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                   *)otherFiles_local,local_40,(string *)mf_local);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"VirtualDirectory",(allocator *)((long)&info.Implementation + 7));
  cmXMLWriter::StartElement(pcVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&info.Implementation + 7));
  cmXMLWriter::Attribute<char[8]>(local_40,"Name",(char (*) [8])0xa2ac40);
  CreateFoldersAndFiles
            (this,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)_xml_local,local_40,(string *)mf_local);
  cmXMLWriter::EndElement(local_40);
  this_00 = (SystemInformation *)((long)&codeliteCompilerName.field_2 + 8);
  cmsys::SystemInformation::SystemInformation(this_00);
  cmsys::SystemInformation::RunCPUCheck(this_00);
  uVar2 = cmsys::SystemInformation::GetNumberOfLogicalCPU
                    ((SystemInformation *)((long)&codeliteCompilerName.field_2 + 8));
  uVar3 = cmsys::SystemInformation::GetNumberOfPhysicalCPU
                    ((SystemInformation *)((long)&codeliteCompilerName.field_2 + 8));
  remote = (char *)(ulong)uVar3;
  this->CpuCount = uVar2 * uVar3;
  GetCodeLiteCompilerName_abi_cxx11_((string *)local_c8,this,(cmMakefile *)xml);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"Settings",&local_e9);
  cmXMLWriter::StartElement(pcVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  cmXMLWriter::Attribute<std::__cxx11::string>(local_40,"Type",projectType);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"Configuration",&local_111);
  cmXMLWriter::StartElement(pcVar1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  cmXMLWriter::Attribute<std::__cxx11::string>(local_40,"Name",&this->ConfigName);
  pcVar1 = local_40;
  GetCodeLiteCompilerName_abi_cxx11_(&local_138,this,(cmMakefile *)xml);
  cmXMLWriter::Attribute<std::__cxx11::string>(pcVar1,"CompilerType",&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  cmXMLWriter::Attribute<char[17]>(local_40,"DebuggerType",(char (*) [17])"GNU gdb debugger");
  cmXMLWriter::Attribute<std::__cxx11::string>(local_40,"Type",projectType);
  cmXMLWriter::Attribute<char[7]>(local_40,"BuildCmpWithGlobalSettings",(char (*) [7])0xa21617);
  cmXMLWriter::Attribute<char[7]>(local_40,"BuildLnkWithGlobalSettings",(char (*) [7])0xa21617);
  cmXMLWriter::Attribute<char[7]>(local_40,"BuildResWithGlobalSettings",(char (*) [7])0xa21617);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"Compiler",&local_159);
  cmXMLWriter::StartElement(pcVar1,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  cmXMLWriter::Attribute<char[3]>(local_40,"Options",(char (*) [3])"-g");
  cmXMLWriter::Attribute<char[4]>(local_40,"Required",(char (*) [4])"yes");
  cmXMLWriter::Attribute<char[1]>(local_40,"PreCompiledHeader",(char (*) [1])0xa535dc);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"IncludePath",&local_181);
  cmXMLWriter::StartElement(pcVar1,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  cmXMLWriter::Attribute<char[2]>(local_40,"Value",(char (*) [2])0xa2ac3d);
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"Linker",&local_1a9);
  cmXMLWriter::StartElement(pcVar1,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  cmXMLWriter::Attribute<char[1]>(local_40,"Options",(char (*) [1])0xa535dc);
  cmXMLWriter::Attribute<char[4]>(local_40,"Required",(char (*) [4])"yes");
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"ResourceCompiler",&local_1d1);
  cmXMLWriter::StartElement(pcVar1,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  cmXMLWriter::Attribute<char[1]>(local_40,"Options",(char (*) [1])0xa535dc);
  cmXMLWriter::Attribute<char[3]>(local_40,"Required",(char (*) [3])0xa52b8e);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f8,"General",(allocator *)(outputPath.field_2._M_local_buf + 0xf));
  cmXMLWriter::StartElement(pcVar1,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)(outputPath.field_2._M_local_buf + 0xf));
  pcVar1 = xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_240,"EXECUTABLE_OUTPUT_PATH",
             (allocator *)(relapath.field_2._M_local_buf + 0xf));
  pcVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)pcVar1,&local_240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,pcVar4,(allocator *)(relapath.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(relapath.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)(relapath.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_268);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    this_01 = (cmSystemTools *)std::__cxx11::string::c_str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::RelativePath_abi_cxx11_(&local_288,this_01,pcVar4,remote);
    std::__cxx11::string::operator=((string *)local_268,(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    pcVar1 = local_40;
    std::operator+(&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                   "/$(ProjectName)");
    cmXMLWriter::Attribute<std::__cxx11::string>(pcVar1,"OutputFile",&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  else {
    cmXMLWriter::Attribute<char[40]>
              (local_40,"OutputFile",(char (*) [40])"$(IntermediateDirectory)/$(ProjectName)");
  }
  cmXMLWriter::Attribute<char[3]>(local_40,"IntermediateDirectory",(char (*) [3])0xa3833b);
  cmXMLWriter::Attribute<char[17]>(local_40,"Command",(char (*) [17])"./$(ProjectName)");
  cmXMLWriter::Attribute<char[1]>(local_40,"CommandArguments",(char (*) [1])0xa535dc);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>
              (local_40,"WorkingDirectory",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
  }
  else {
    cmXMLWriter::Attribute<char[25]>
              (local_40,"WorkingDirectory",(char (*) [25])"$(IntermediateDirectory)");
  }
  cmXMLWriter::Attribute<char[4]>(local_40,"PauseExecWhenProcTerminates",(char (*) [4])"yes");
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"Debugger",&local_2c9);
  cmXMLWriter::StartElement(pcVar1,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  cmXMLWriter::Attribute<char[3]>(local_40,"IsRemote",(char (*) [3])0xa52b8e);
  cmXMLWriter::Attribute<char[1]>(local_40,"RemoteHostName",(char (*) [1])0xa535dc);
  cmXMLWriter::Attribute<char[1]>(local_40,"RemoteHostPort",(char (*) [1])0xa535dc);
  cmXMLWriter::Attribute<char[1]>(local_40,"DebuggerPath",(char (*) [1])0xa535dc);
  cmXMLWriter::Element(local_40,"PostConnectCommands");
  cmXMLWriter::Element(local_40,"StartupCommands");
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::Element(local_40,"PreBuild");
  cmXMLWriter::Element(local_40,"PostBuild");
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"CustomBuild",&local_2f1);
  cmXMLWriter::StartElement(pcVar1,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  cmXMLWriter::Attribute<char[4]>(local_40,"Enabled",(char (*) [4])"yes");
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"RebuildCommand",&local_319);
  GetRebuildCommand(&local_340,this,(cmMakefile *)xml,targetName);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_318,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_360,"CleanCommand",&local_361);
  GetCleanCommand(&local_388,this,(cmMakefile *)xml,targetName);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_360,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a8,"BuildCommand",&local_3a9);
  GetBuildCommand(&local_3d0,this,(cmMakefile *)xml,targetName);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_3a8,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"SingleFileCommand",&local_3f1);
  GetSingleFileBuildCommand_abi_cxx11_(&local_418,this,(cmMakefile *)xml);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_3f0,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  cmXMLWriter::Element(local_40,"PreprocessFileCommand");
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"WorkingDirectory",&local_439);
  cmXMLWriter::Element<char[17]>(pcVar1,&local_438,(char (*) [17])"$(WorkspacePath)");
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"AdditionalRules",&local_461);
  cmXMLWriter::StartElement(pcVar1,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  cmXMLWriter::Element(local_40,"CustomPostBuild");
  cmXMLWriter::Element(local_40,"CustomPreBuild");
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_488,"GlobalSettings",&local_489);
  cmXMLWriter::StartElement(pcVar1,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b0,"Compiler",&local_4b1);
  cmXMLWriter::StartElement(pcVar1,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  cmXMLWriter::Attribute<char[1]>(local_40,"Options",(char (*) [1])0xa535dc);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d8,"IncludePath",&local_4d9);
  cmXMLWriter::StartElement(pcVar1,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  cmXMLWriter::Attribute<char[2]>(local_40,"Value",(char (*) [2])0xa2ac3d);
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_500,"Linker",&local_501);
  cmXMLWriter::StartElement(pcVar1,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  cmXMLWriter::Attribute<char[1]>(local_40,"Options",(char (*) [1])0xa535dc);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_528,"LibraryPath",&local_529);
  cmXMLWriter::StartElement(pcVar1,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  cmXMLWriter::Attribute<char[2]>(local_40,"Value",(char (*) [2])0xa2ac3d);
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"ResourceCompiler",&local_551);
  cmXMLWriter::StartElement(pcVar1,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  cmXMLWriter::Attribute<char[1]>(local_40,"Options",(char (*) [1])0xa535dc);
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string((string *)local_c8);
  cmsys::SystemInformation::~SystemInformation
            ((SystemInformation *)((long)&codeliteCompilerName.field_2 + 8));
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateProjectSourceEntries(
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles, cmXMLWriter* _xml,
  const std::string& projectPath, const cmMakefile* mf,
  const std::string& projectType, const std::string& targetName)
{

  cmXMLWriter& xml(*_xml);
  FindMatchingHeaderfiles(cFiles, otherFiles);
  // Create 2 virtual folders: src and include
  // and place all the implementation files into the src
  // folder, the rest goes to the include folder
  xml.StartElement("VirtualDirectory");
  xml.Attribute("Name", "src");

  // insert all source files in the codelite project
  // first the C/C++ implementation files, then all others
  this->CreateFoldersAndFiles(cFiles, xml, projectPath);
  xml.EndElement(); // VirtualDirectory

  xml.StartElement("VirtualDirectory");
  xml.Attribute("Name", "include");
  this->CreateFoldersAndFiles(otherFiles, xml, projectPath);
  xml.EndElement(); // VirtualDirectory

  // Get the number of CPUs. We use this information for the make -jN
  // command
  cmsys::SystemInformation info;
  info.RunCPUCheck();

  this->CpuCount =
    info.GetNumberOfLogicalCPU() * info.GetNumberOfPhysicalCPU();

  std::string codeliteCompilerName = this->GetCodeLiteCompilerName(mf);

  xml.StartElement("Settings");
  xml.Attribute("Type", projectType);

  xml.StartElement("Configuration");
  xml.Attribute("Name", this->ConfigName);
  xml.Attribute("CompilerType", this->GetCodeLiteCompilerName(mf));
  xml.Attribute("DebuggerType", "GNU gdb debugger");
  xml.Attribute("Type", projectType);
  xml.Attribute("BuildCmpWithGlobalSettings", "append");
  xml.Attribute("BuildLnkWithGlobalSettings", "append");
  xml.Attribute("BuildResWithGlobalSettings", "append");

  xml.StartElement("Compiler");
  xml.Attribute("Options", "-g");
  xml.Attribute("Required", "yes");
  xml.Attribute("PreCompiledHeader", "");
  xml.StartElement("IncludePath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // IncludePath
  xml.EndElement(); // Compiler

  xml.StartElement("Linker");
  xml.Attribute("Options", "");
  xml.Attribute("Required", "yes");
  xml.EndElement(); // Linker

  xml.StartElement("ResourceCompiler");
  xml.Attribute("Options", "");
  xml.Attribute("Required", "no");
  xml.EndElement(); // ResourceCompiler

  xml.StartElement("General");
  std::string outputPath = mf->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  std::string relapath;
  if (!outputPath.empty()) {
    relapath = cmSystemTools::RelativePath(this->WorkspacePath.c_str(),
                                           outputPath.c_str());
    xml.Attribute("OutputFile", relapath + "/$(ProjectName)");
  } else {
    xml.Attribute("OutputFile", "$(IntermediateDirectory)/$(ProjectName)");
  }
  xml.Attribute("IntermediateDirectory", "./");
  xml.Attribute("Command", "./$(ProjectName)");
  xml.Attribute("CommandArguments", "");
  if (!outputPath.empty()) {
    xml.Attribute("WorkingDirectory", relapath);
  } else {
    xml.Attribute("WorkingDirectory", "$(IntermediateDirectory)");
  }
  xml.Attribute("PauseExecWhenProcTerminates", "yes");
  xml.EndElement(); // General

  xml.StartElement("Debugger");
  xml.Attribute("IsRemote", "no");
  xml.Attribute("RemoteHostName", "");
  xml.Attribute("RemoteHostPort", "");
  xml.Attribute("DebuggerPath", "");
  xml.Element("PostConnectCommands");
  xml.Element("StartupCommands");
  xml.EndElement(); // Debugger

  xml.Element("PreBuild");
  xml.Element("PostBuild");

  xml.StartElement("CustomBuild");
  xml.Attribute("Enabled", "yes");
  xml.Element("RebuildCommand", GetRebuildCommand(mf, targetName));
  xml.Element("CleanCommand", GetCleanCommand(mf, targetName));
  xml.Element("BuildCommand", GetBuildCommand(mf, targetName));
  xml.Element("SingleFileCommand", GetSingleFileBuildCommand(mf));
  xml.Element("PreprocessFileCommand");
  xml.Element("WorkingDirectory", "$(WorkspacePath)");
  xml.EndElement(); // CustomBuild

  xml.StartElement("AdditionalRules");
  xml.Element("CustomPostBuild");
  xml.Element("CustomPreBuild");
  xml.EndElement(); // AdditionalRules

  xml.EndElement(); // Configuration
  xml.StartElement("GlobalSettings");

  xml.StartElement("Compiler");
  xml.Attribute("Options", "");
  xml.StartElement("IncludePath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // IncludePath
  xml.EndElement(); // Compiler

  xml.StartElement("Linker");
  xml.Attribute("Options", "");
  xml.StartElement("LibraryPath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // LibraryPath
  xml.EndElement(); // Linker

  xml.StartElement("ResourceCompiler");
  xml.Attribute("Options", "");
  xml.EndElement(); // ResourceCompiler

  xml.EndElement(); // GlobalSettings
  xml.EndElement(); // Settings
}